

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lucas.c
# Opt level: O3

void convolve_Gaussian(uchar (*inpic) [512] [512],float (*floatpic) [512] [512],
                      uchar (*pic) [512] [512],float sigma,int pic_t,int pic_x,int pic_y,int start,
                      int frame,int time)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  float *pfVar5;
  long lVar6;
  uint uVar7;
  float *pfVar8;
  ulong uVar9;
  float (*pafVar10) [512];
  uchar (*pauVar11) [512];
  uint uVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  float fVar17;
  double dVar18;
  double dVar19;
  float fVar20;
  float mask [100];
  uchar (*local_1e8) [512];
  float local_1c8 [102];
  
  if (OUTPUT_SMOOTH != 0) {
    puts("\nStart of 3D convolution");
    printf("Time: %d Frame: %d\n",(ulong)(uint)time,(ulong)(uint)frame);
  }
  fflush(_stdout);
  uVar12 = (uint)(sigma * 6.0 + 1.0);
  uVar7 = uVar12 | 1;
  if (pic_t < (int)uVar7) {
    puts("\nFatal error: not enough images");
    exit(1);
  }
  uVar1 = (int)(uVar7 - ((int)uVar12 >> 0x1f)) >> 1;
  if ((sigma != 0.0) || (NAN(sigma))) {
    if ((int)uVar12 < 0) {
      dVar18 = 0.0;
    }
    else {
      dVar18 = (double)sigma;
      fVar20 = 0.0;
      uVar4 = 0;
      do {
        iVar2 = (int)uVar4 - uVar1;
        dVar19 = exp((double)-(iVar2 * iVar2) / ((dVar18 + dVar18) * dVar18));
        fVar17 = (float)(dVar19 * (1.0 / (dVar18 * 2.5066282746310002)));
        local_1c8[uVar4] = fVar17;
        fVar20 = fVar20 + fVar17;
        uVar4 = uVar4 + 1;
      } while (uVar7 != uVar4);
      dVar18 = (double)fVar20;
    }
  }
  else {
    local_1c8[0] = 1.0;
    dVar18 = 1.0;
  }
  if (OUTPUT_SMOOTH != 0) {
    printf("Size: %d Offset: %d\nMask values: ",(ulong)uVar7,(ulong)uVar1);
    if (-1 < (int)uVar12) {
      uVar4 = 0;
      do {
        printf("%f ",(double)local_1c8[uVar4]);
        uVar4 = uVar4 + 1;
      } while (uVar7 != uVar4);
    }
    printf("\nSum of mask values: %f\n",dVar18);
  }
  if (pic_x < 1) {
    if ((sigma != 0.0) || (NAN(sigma))) goto LAB_00104f48;
  }
  else {
    uVar13 = (ulong)(uint)pic_y;
    uVar4 = (ulong)(uint)pic_x;
    lVar16 = 0;
    do {
      if (0 < pic_y) {
        memset((void *)((long)pic1[0] + lVar16),0,uVar13 * 4);
        memset((void *)((long)pic0[0] + lVar16),0,uVar13 * 4);
      }
      lVar16 = lVar16 + 0x800;
    } while (uVar4 << 0xb != lVar16);
    if ((sigma != 0.0) || (NAN(sigma))) {
      if (0 < pic_x) {
        uVar12 = -uVar1;
        if (uVar1 != uVar12 && SBORROW4(uVar1,uVar12) == (int)(uVar1 * 2) < 0) {
          uVar12 = uVar1;
        }
        uVar3 = 0;
        do {
          if (0 < pic_y) {
            uVar9 = 0;
            do {
              fVar20 = 0.0;
              if (-2 < (int)uVar7) {
                lVar16 = 0;
                do {
                  fVar20 = fVar20 + (float)inpic[(int)((int)lVar16 + ((frame - uVar1) - start))]
                                           [uVar3][uVar9] * local_1c8[lVar16];
                  lVar16 = lVar16 + 1;
                } while (uVar12 + uVar1 + 1 != (int)lVar16);
              }
              pic0[uVar3][uVar9] = fVar20;
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar13);
          }
          uVar3 = uVar3 + 1;
        } while (uVar3 != uVar4);
      }
LAB_00104f48:
      if (OUTPUT_SMOOTH != 0) {
        puts("Convolution in t direction completed");
      }
      iVar2 = pic_x - uVar1;
      if ((int)uVar1 < iVar2) {
        uVar12 = -uVar1;
        lVar16 = (long)(int)uVar1;
        if (uVar1 != uVar12 && SBORROW4(uVar1,uVar12) == (int)(uVar1 * 2) < 0) {
          uVar12 = uVar1;
        }
        pafVar10 = pic0;
        do {
          if (0 < pic_y) {
            uVar4 = 0;
            pfVar8 = *pafVar10;
            do {
              fVar20 = 0.0;
              if (-2 < (int)uVar7) {
                lVar14 = 0;
                pfVar5 = pfVar8;
                do {
                  fVar20 = fVar20 + *pfVar5 * local_1c8[lVar14];
                  lVar14 = lVar14 + 1;
                  pfVar5 = pfVar5 + 0x200;
                } while (uVar12 + uVar1 + 1 != (int)lVar14);
              }
              pic1[lVar16][uVar4] = fVar20;
              uVar4 = uVar4 + 1;
              pfVar8 = pfVar8 + 1;
            } while (uVar4 != (uint)pic_y);
          }
          lVar16 = lVar16 + 1;
          pafVar10 = (float (*) [512])((long)pafVar10 + 0x800);
        } while (lVar16 != iVar2);
      }
      if (OUTPUT_SMOOTH != 0) {
        puts("Convolution in x direction completed");
      }
      if ((int)uVar1 < iVar2) {
        uVar12 = -uVar1;
        lVar16 = (long)(int)uVar1;
        pfVar8 = pic1[lVar16];
        if (uVar1 != uVar12 && SBORROW4(uVar1,uVar12) == (int)(uVar1 * 2) < 0) {
          uVar12 = uVar1;
        }
        lVar14 = lVar16;
        do {
          lVar6 = lVar16;
          pfVar5 = pfVar8;
          if ((int)uVar1 < (int)(pic_y - uVar1)) {
            do {
              fVar20 = 0.0;
              if (-2 < (int)uVar7) {
                lVar15 = 0;
                do {
                  fVar20 = fVar20 + pfVar5[lVar15] * local_1c8[lVar15];
                  lVar15 = lVar15 + 1;
                } while (uVar12 + uVar1 + 1 != (int)lVar15);
              }
              fVar17 = 255.0;
              if (fVar20 <= 255.0) {
                fVar17 = fVar20;
              }
              fVar20 = 0.0;
              if (0.0 <= fVar17) {
                fVar20 = fVar17;
              }
              floatpic[time][lVar14][lVar6] = fVar20;
              pic[time][lVar14][lVar6] = (uchar)(int)(fVar20 + 0.5);
              lVar6 = lVar6 + 1;
              pfVar5 = pfVar5 + 1;
            } while (lVar6 != (int)(pic_y - uVar1));
          }
          lVar14 = lVar14 + 1;
          pfVar8 = pfVar8 + 0x200;
        } while (lVar14 != iVar2);
      }
      if (OUTPUT_SMOOTH == 0) goto LAB_001051a5;
      puts("Convolution in y direction completed");
    }
    else if (0 < pic_x) {
      local_1e8 = inpic[(long)frame - (long)start];
      pauVar11 = pic[time];
      uVar3 = 0;
      do {
        if (0 < pic_y) {
          uVar9 = 0;
          do {
            (*(uchar (*) [512])*pauVar11)[uVar9] = (*(uchar (*) [512])*local_1e8)[uVar9];
            uVar9 = uVar9 + 1;
          } while (uVar13 != uVar9);
        }
        uVar3 = uVar3 + 1;
        local_1e8 = local_1e8 + 1;
        pauVar11 = pauVar11 + 1;
      } while (uVar3 != uVar4);
    }
  }
  if (OUTPUT_SMOOTH != 0) {
    puts("End of Convolution");
  }
LAB_001051a5:
  fflush(_stdout);
  return;
}

Assistant:

void convolve_Gaussian(
unsigned char inpic[PIC_T][PIC_X][PIC_Y],
float floatpic[FIVE][PIC_X][PIC_Y],
unsigned char pic[FIVE][PIC_X][PIC_Y],
float sigma, int pic_t, int pic_x, int pic_y,
int start, int frame, int time)
{
float mask[100],term,sum;
int size,i,j,offset,a,b;


if(OUTPUT_SMOOTH)
{
printf("\nStart of 3D convolution\n");
printf("Time: %d Frame: %d\n",time,frame);
}

fflush(stdout);
size = (int) (6*sigma+1);
if(size%2==0) size = size+1;
offset = size/2;
if(pic_t < size)
	{
	printf("\nFatal error: not enough images\n");
	exit(1);
	}
sum = 0.0;

if(sigma != 0.0)
for(i=0;i<size;i++)
	{
	mask[i] = (1.0/(sqrt(2.0*M_PI)*sigma))*
		exp(-(i-offset)*(i-offset)/(2.0*sigma*sigma));
	sum = sum+mask[i];
	}
else { mask[0] = 1.0; sum = 1.0; }

if(OUTPUT_SMOOTH)
{
printf("Size: %d Offset: %d\nMask values: ",size,offset);
for(i=0;i<size;i++)
	printf("%f ",mask[i]);
printf("\nSum of mask values: %f\n",sum);
}
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	pic0[i][j] = pic1[i][j] = 0.0;


if(sigma != 0.0)
{
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	{
	term = 0.0;
	for(a=-offset;a<=offset;a++)
		{
		term = term +(inpic[a+frame-start][i][j]*mask[a+offset]);
		}
	pic0[i][j] = term;
	}
if(OUTPUT_SMOOTH) printf("Convolution in t direction completed\n");
for(i=offset;i<pic_x-offset;i++)
for(j=0;j<pic_y;j++)
	{
	term = 0.0;
	for(a=-offset;a<=offset;a++)
		{
		term = term + (pic0[i+a][j]*mask[a+offset]);
		}
	pic1[i][j] = term;
	}
if(OUTPUT_SMOOTH) printf("Convolution in x direction completed\n");

for(i=offset;i<pic_x-offset;i++)
for(j=offset;j<pic_y-offset;j++)
	{
	term = 0.0;
	for(b=-offset;b<=offset;b++)
		{
		term = term + (pic1[i][j+b])*mask[b+offset];
		}
	if(term > 255.0) term = 255.0;
	if(term < 0.0) term = 0.0;
	floatpic[time][i][j] = term;
	pic[time][i][j] = (int) (term+0.5);
	}
if(OUTPUT_SMOOTH) printf("Convolution in y direction completed\n");
}
else /* No smoothing */
for(i=0;i<pic_x;i++)
for(j=0;j<pic_y;j++)
	pic[time][i][j] = inpic[frame-start][i][j];

if(OUTPUT_SMOOTH) printf("End of Convolution\n");
fflush(stdout);
}